

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O0

shared_ptr<ccs::SearchState> __thiscall
ccs::SearchState::newChild(SearchState *this,shared_ptr<const_ccs::SearchState> *parent,Key *key)

{
  bool bVar1;
  SearchState *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  bool bVar3;
  shared_ptr<ccs::SearchState> sVar4;
  SearchState *local_40;
  SearchState *p;
  bool constraintsChanged;
  Key *key_local;
  shared_ptr<const_ccs::SearchState> *parent_local;
  shared_ptr<ccs::SearchState> *searchState;
  
  this_00 = (SearchState *)operator_new(0xf8);
  SearchState(this_00,parent,key);
  std::shared_ptr<ccs::SearchState>::shared_ptr<ccs::SearchState,void>
            ((shared_ptr<ccs::SearchState> *)this,this_00);
  do {
    bVar3 = false;
    local_40 = std::__shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::get
                         (&parent->
                           super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>);
    _Var2._M_pi = extraout_RDX;
    while (local_40 != (SearchState *)0x0) {
      this_01 = std::__shared_ptr_access<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      bVar1 = extendWith(this_01,local_40);
      bVar3 = bVar3 || bVar1;
      local_40 = std::__shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(local_40->parent).
                             super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>)
      ;
      _Var2._M_pi = extraout_RDX_00;
    }
  } while (bVar3);
  sVar4.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ccs::SearchState>)
         sVar4.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SearchState> SearchState::newChild(
    const std::shared_ptr<const SearchState> &parent, const Key &key) {
  std::shared_ptr<SearchState> searchState(new SearchState(parent, key));

  bool constraintsChanged;
  do {
    constraintsChanged = false;
    const SearchState *p = parent.get();
    while (p) {
      constraintsChanged |= searchState->extendWith(*p);
      p = p->parent.get();
    }
  } while (constraintsChanged);

  return searchState;
}